

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ptr<std::vector<ptr<log_entry>_>_> __thiscall
nuraft::inmem_log_store::log_entries_ext
          (inmem_log_store *this,ulong start,ulong end,int64 batch_size_hint_in_bytes)

{
  bool bVar1;
  buffer *this_00;
  element_type *in_RCX;
  element_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  ptr<std::vector<std::shared_ptr<nuraft::log_entry>_>_> pVar3;
  ptr<std::vector<ptr<log_entry>_>_> pVar4;
  iterator entry;
  lock_guard<std::mutex> l;
  ptr<log_entry> src;
  ulong ii;
  size_t accum_size;
  ptr<std::vector<ptr<log_entry>_>_> *ret;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff18;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *in_stack_ffffffffffffff20;
  log_entry *this_01;
  ptr<log_entry> *in_stack_ffffffffffffff78;
  _Self local_78;
  _Self local_70 [4];
  log_entry local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  element_type *local_18;
  
  local_50.timestamp_us_._7_1_ = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  pVar3 = cs_new<std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>
                    ();
  _Var2 = pVar3.
          super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if (-1 < (long)local_28) {
    local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    for (local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
              local_18;
        local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr <
        local_20; local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = local_50.buff_.
                           super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
        ) {
      std::shared_ptr<nuraft::log_entry>::shared_ptr
                ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffff20,
                 (mutex_type *)in_stack_ffffffffffffff18);
      local_70[0]._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
           ::find(in_stack_ffffffffffffff18,(key_type *)0x1aad7a);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
           ::end(in_stack_ffffffffffffff18);
      bVar1 = std::operator==(local_70,&local_78);
      if (bVar1) {
        in_stack_ffffffffffffff78 = (ptr<log_entry> *)0x0;
        local_70[0]._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
             ::find(in_stack_ffffffffffffff18,(key_type *)0x1aadcf);
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>::
      operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>
                  *)0x1aae35);
      this_01 = &local_50;
      std::shared_ptr<nuraft::log_entry>::operator=
                ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff20,
                 (shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff18);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1aae5b);
      std::
      __shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1aae65);
      make_clone(in_stack_ffffffffffffff78);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back(in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1aae96);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1aaea3);
      this_00 = log_entry::get_buf(this_01);
      in_stack_ffffffffffffff20 =
           (vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            *)nuraft::buffer::size(this_00);
      local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_vptr__Sp_counted_base +
              (long)&in_stack_ffffffffffffff20->
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              );
      if ((local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (local_50.buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi < local_28)) {
        local_50.timestamp_us_._0_4_ = 0;
      }
      else {
        local_50.timestamp_us_._0_4_ = 2;
      }
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1aaf3a);
      _Var2._M_pi = extraout_RDX;
      if ((int)local_50.timestamp_us_ != 0) break;
    }
  }
  pVar4.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  pVar4.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ptr<std::vector<ptr<log_entry>_>_>)
         pVar4.
         super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<std::vector<ptr<log_entry>>>
    inmem_log_store::log_entries_ext(ulong start,
                                     ulong end,
                                     int64 batch_size_hint_in_bytes)
{
    ptr< std::vector< ptr<log_entry> > > ret =
        cs_new< std::vector< ptr<log_entry> > >();

    if (batch_size_hint_in_bytes < 0) {
        return ret;
    }

    size_t accum_size = 0;
    for (ulong ii = start ; ii < end ; ++ii) {
        ptr<log_entry> src = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            auto entry = logs_.find(ii);
            if (entry == logs_.end()) {
                entry = logs_.find(0);
                assert(0);
            }
            src = entry->second;
        }
        ret->push_back(make_clone(src));
        accum_size += src->get_buf().size();
        if (batch_size_hint_in_bytes &&
            accum_size >= (ulong)batch_size_hint_in_bytes) break;
    }
    return ret;
}